

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

value * __thiscall cppcms::json::value::operator[](value *this,size_t n)

{
  variant *this_00;
  vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *pvVar1;
  bad_value_cast *pbVar2;
  string local_40;
  
  this_00 = &((this->d).d.ptr_)->value_;
  if (this_00->type != is_array) {
    pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    bad_value_cast::bad_value_cast(pbVar2,&local_40,(((this->d).d.ptr_)->value_).type,is_array);
    __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  pvVar1 = variant::get<std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>
                     (this_00);
  if (n < (ulong)((long)(pvVar1->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar1->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pvVar1 = variant::get<std::vector<cppcms::json::value,std::allocator<cppcms::json::value>>>
                       (&((this->d).d.ptr_)->value_);
    return (pvVar1->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
           _M_impl.super__Vector_impl_data._M_start + n;
  }
  pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Index out of range","");
  bad_value_cast::bad_value_cast(pbVar2,&local_40);
  __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::operator[](size_t n) const
	{
		if(type()!=json::is_array)
			throw bad_value_cast("",type(),json::is_array);
		if(n >= array().size())
			throw bad_value_cast("Index out of range");
		return array()[n];
	}